

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_doinsert(t_list_store *x,t_symbol *s,int argc,t_atom *argv,int index)

{
  t_listelem *ptVar1;
  t_listelem *ptVar2;
  t_listelem *oldptr;
  int index_local;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_list_store *x_local;
  
  ptVar1 = (x->x_alist).l_vec;
  ptVar2 = (t_listelem *)
           resizebytes((x->x_alist).l_vec,(long)(x->x_alist).l_n * 0x28,
                       (long)((x->x_alist).l_n + argc) * 0x28);
  (x->x_alist).l_vec = ptVar2;
  if (ptVar2 == (t_listelem *)0x0) {
    (x->x_alist).l_n = 0;
    pd_error((void *)0x0,"list: out of memory");
  }
  else {
    if (((x->x_alist).l_vec != ptVar1) && ((x->x_alist).l_npointer != 0)) {
      alist_restore_gpointers(&x->x_alist,0,(x->x_alist).l_n);
    }
    if ((index < (x->x_alist).l_n) &&
       (memmove((x->x_alist).l_vec + (long)index + (long)argc,(x->x_alist).l_vec + index,
                (long)((x->x_alist).l_n - index) * 0x28), (x->x_alist).l_npointer != 0)) {
      alist_restore_gpointers(&x->x_alist,index + argc,(x->x_alist).l_n - index);
    }
    alist_copyin(&x->x_alist,s,argc,argv,index);
    (x->x_alist).l_n = argc + (x->x_alist).l_n;
  }
  return;
}

Assistant:

static void list_store_doinsert(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv, int index)
{
    t_listelem *oldptr = x->x_alist.l_vec;
        /* try to allocate more memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n + argc) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
        /* fix gpointers in case resizebytes() has moved the alist in memory */
    if (x->x_alist.l_vec != oldptr && x->x_alist.l_npointer)
        alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n);
        /* shift existing elements after 'index' to the right */
    if (index < x->x_alist.l_n)
    {
        memmove(x->x_alist.l_vec + index + argc, x->x_alist.l_vec + index,
            (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
            /* fix gpointers because of memmove() */
        if (x->x_alist.l_npointer)
            alist_restore_gpointers(&x->x_alist, index + argc, x->x_alist.l_n - index);
    }
        /* finally copy new elements */
    alist_copyin(&x->x_alist, s, argc, argv, index);
    x->x_alist.l_n += argc;
}